

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.c
# Opt level: O0

u8 * write_varint(u32 value,u8 *dst_begin,u8 *dst_max_end)

{
  byte bVar1;
  u8 *local_30;
  u8 *dst;
  u8 *dst_max_end_local;
  u8 *dst_begin_local;
  u32 value_local;
  
  bVar1 = (byte)value;
  if (value < 0x80) {
    if (dst_max_end < dst_begin + 1) {
      return (u8 *)0x0;
    }
    local_30 = dst_begin + 1;
    *dst_begin = bVar1;
  }
  else if (value < 0x4000) {
    if (dst_max_end < dst_begin + 2) {
      return (u8 *)0x0;
    }
    *dst_begin = bVar1 & 0x7f | 0x80;
    local_30 = dst_begin + 2;
    dst_begin[1] = (byte)(value >> 7) & 0x7f;
  }
  else {
    if (0x1fffff < value) {
      __assert_fail("value < 0x200000",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/rewind.c",
                    0x85,"u8 *write_varint(u32, u8 *, u8 *)");
    }
    if (dst_max_end < dst_begin + 3) {
      return (u8 *)0x0;
    }
    *dst_begin = bVar1 & 0x7f | 0x80;
    dst_begin[1] = (byte)(value >> 7) & 0x7f | 0x80;
    local_30 = dst_begin + 3;
    dst_begin[2] = (byte)(value >> 0xe) & 0x7f;
  }
  return local_30;
}

Assistant:

static u8* write_varint(u32 value, u8* dst_begin, u8* dst_max_end) {
  u8* dst = dst_begin;
  if (value < 0x80) {
    CHECK_WRITE(1, dst, dst_max_end);
    *dst++ = (u8)value;
  } else if (value < 0x4000) {
    CHECK_WRITE(2, dst, dst_max_end);
    *dst++ = 0x80 | (value & 0x7f);
    *dst++ = (value >> 7) & 0x7f;
  } else {
    /* If this fires there is a run of 2Mib. In the current EmulatorState this
     * is impossible. */
    assert(value < 0x200000);
    CHECK_WRITE(3, dst, dst_max_end);
    *dst++ = 0x80 | (value & 0x7f);
    *dst++ = 0x80 | ((value >> 7) & 0x7f);
    *dst++ = (value >> 14) & 0x7f;
  }
  return dst;
}